

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O0

void emitter_kv_note(emitter_t *emitter,char *json_key,char *table_key,emitter_type_t value_type,
                    void *value,char *table_note_key,emitter_type_t table_note_value_type,
                    void *table_note_value)

{
  emitter_type_t in_ECX;
  char *in_RDX;
  emitter_t *in_RSI;
  int *in_RDI;
  void *in_R8;
  emitter_t *in_R9;
  void *unaff_retaddr;
  char *in_stack_ffffffffffffffc8;
  
  if (*in_RDI == 0) {
    emitter_json_key(in_R9,in_stack_ffffffffffffffc8);
    emitter_json_value(in_R9,(emitter_type_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                       (void *)0x25ba56);
  }
  else {
    emitter_table_kv_note
              (in_RSI,in_RDX,in_ECX,in_R8,(char *)in_R9,(emitter_type_t)((ulong)value >> 0x20),
               unaff_retaddr);
  }
  *(undefined1 *)(in_RDI + 7) = 1;
  return;
}

Assistant:

static inline void
emitter_kv_note(emitter_t *emitter, const char *json_key, const char *table_key,
    emitter_type_t value_type, const void *value,
    const char *table_note_key, emitter_type_t table_note_value_type,
    const void *table_note_value) {
	if (emitter->output == emitter_output_json) {
		emitter_json_key(emitter, json_key);
		emitter_json_value(emitter, value_type, value);
	} else {
		emitter_table_kv_note(emitter, table_key, value_type, value,
		    table_note_key, table_note_value_type, table_note_value);
	}
	emitter->item_at_depth = true;
}